

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_client.cpp
# Opt level: O2

int __thiscall
cppcms::impl::tcp_cache::fetch
          (tcp_cache *this,string *key,string *a,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags,time_t *timeout,uint64_t *generation,bool transfer_if_not_updated)

{
  messenger *this_00;
  size_t sVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  char *__s;
  tcp_operation_header local_a8;
  ulong *local_80;
  string *local_78;
  string tag;
  string data;
  
  local_80 = (ulong *)timeout;
  local_78 = a;
  std::__cxx11::string::string((string *)&data,(string *)key);
  local_a8.filler[0] = 0;
  local_a8.filler[1] = 0;
  local_a8.operations.fetch.current_gen = 0;
  local_a8.operations._16_8_ = 0;
  local_a8._0_8_ = (ulong)(uint)data._M_string_length << 0x20;
  local_a8.operations.store.data_len = 0;
  local_a8.operations.fetch.key_len = (uint)data._M_string_length;
  if (transfer_if_not_updated) {
    local_a8.operations.store.data_len = 2;
    local_a8.operations.fetch.current_gen = *generation;
    uVar4 = 3;
  }
  else {
    uVar4 = 1;
  }
  if (tags != (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    local_a8.operations.store.data_len = uVar4;
  }
  this_00 = tcp_connector::get(&this->super_tcp_connector,key);
  messenger::transmit(this_00,&local_a8,&data);
  if (transfer_if_not_updated && local_a8.opcode == 9) {
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    if (local_a8.opcode == 7) {
      *local_80 = local_a8.operations.data.timeout;
      *generation = local_a8.operations.fetch.current_gen;
      std::__cxx11::string::assign((char *)local_78,(ulong)data._M_dataplus._M_p);
      __s = data._M_dataplus._M_p + (local_a8.operations._16_8_ & 0xffffffff);
      for (uVar4 = local_a8.operations.data.triggers_len; 0 < (int)uVar4; uVar4 = uVar4 - uVar3) {
        tag._M_string_length = 0;
        tag.field_2._M_local_buf[0] = '\0';
        tag._M_dataplus._M_p = (pointer)&tag.field_2;
        sVar1 = strlen(__s);
        std::__cxx11::string::assign((char *)&tag,(ulong)__s);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)tags,&tag);
        uVar3 = (int)sVar1 + 1;
        __s = __s + uVar3;
        std::__cxx11::string::~string((string *)&tag);
      }
      iVar2 = 1;
    }
  }
  std::__cxx11::string::~string((string *)&data);
  return iVar2;
}

Assistant:

int tcp_cache::fetch(	std::string const &key,
			std::string &a,
			std::set<std::string> *tags,
			time_t &timeout,
			uint64_t &generation,
			bool transfer_if_not_updated) 
{
	std::string data=key;
	tcp_operation_header h=tcp_operation_header();
	h.opcode=opcodes::fetch;
	h.size=data.size();
	h.operations.fetch.key_len=data.size();
	
	if(transfer_if_not_updated) {
		h.operations.fetch.transfer_if_not_uptodate=1;
		h.operations.fetch.current_gen=generation;
	}
	
	if(tags)
		h.operations.fetch.transfer_triggers = 1;

	get(key).transmit(h,data);

	if(transfer_if_not_updated && h.opcode==opcodes::uptodate)
		return up_to_date;
	if(h.opcode!=opcodes::data)
		return not_found;

	timeout = to_time_t(h.operations.data.timeout);
	
	generation=h.operations.data.generation;

	char const *ptr=data.c_str();

	a.assign(ptr,h.operations.data.data_len);
	ptr+=h.operations.data.data_len;

	int len=h.operations.data.triggers_len;
	while(len>0) {
		std::string tag;
		unsigned tmp_len=strlen(ptr);
		tag.assign(ptr,tmp_len);
		ptr+=tmp_len+1;
		len-=tmp_len+1;
		tags->insert(tag);
	}
	return found;
}